

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

int mcpl_tool(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  mcpl_file_t mVar11;
  mcpl_particle_t *pmVar12;
  mcpl_outfile_t mVar13;
  FILE *__stream;
  char cVar14;
  uint64_t *puVar15;
  uint uVar16;
  mcpl_fileinternal_t *f;
  byte bVar17;
  byte bVar18;
  char *pcVar19;
  bool bVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint64_t uVar24;
  mcpl_fileinternal_t *f_3;
  char *pcVar25;
  mcpl_outfileinternal_t *f_1;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  int64_t opt_num_skip;
  int64_t opt_num_limit;
  uint32_t ldata;
  char comment [1024];
  long *local_4b0;
  bool local_4a0;
  int local_494;
  uint64_t local_478;
  char *local_470;
  char *local_468;
  undefined8 local_460;
  undefined8 local_458;
  uint64_t local_450;
  int local_448;
  uint local_444;
  ulong local_440;
  undefined8 local_438;
  
  local_450 = 0xffffffffffffffff;
  local_478 = 0xffffffffffffffff;
  if (argc < 2) {
    local_4a0 = true;
    bVar18 = 0;
    bVar29 = false;
    bVar27 = false;
    bVar7 = 0;
    local_458 = 0;
    local_460 = 0;
    bVar2 = true;
    bVar17 = 0;
    local_494 = 0;
    cVar5 = '\0';
    cVar4 = '\0';
    local_468 = (char *)0x0;
    local_470 = (char *)0x0;
    local_4b0 = (long *)0x0;
    uVar16 = 0;
    bVar20 = false;
    bVar28 = false;
LAB_001067f4:
    bVar18 = (local_450 != 0xffffffffffffffff) + bVar18 + (local_478 != 0xffffffffffffffff);
    pcVar25 = (char *)0x0;
  }
  else {
    uVar21 = (ulong)(uint)argc;
    uVar16 = 0;
    local_4b0 = (long *)0x0;
    local_470 = (char *)0x0;
    local_468 = (char *)0x0;
    cVar4 = '\0';
    cVar5 = '\0';
    bVar20 = false;
    local_448 = 0;
    local_494 = 0;
    bVar17 = 0;
    bVar3 = false;
    bVar2 = false;
    local_460 = 0;
    local_458 = 0;
    bVar7 = 0;
    bVar27 = false;
    uVar23 = 1;
    local_440 = uVar21;
    do {
      while( true ) {
        uVar26 = uVar23 + 1;
        pcVar25 = argv[uVar23];
        sVar9 = strlen(pcVar25);
        pcVar19 = local_470;
        pcVar6 = local_468;
        uVar23 = uVar26;
        if (sVar9 == 0) goto LAB_00106740;
        if (sVar9 != 1) break;
        cVar14 = *pcVar25;
LAB_00106589:
        if (cVar14 == '-') {
LAB_001068a8:
          free(local_4b0);
          pcVar25 = "Bad arguments";
          goto LAB_001072ef;
        }
LAB_00106592:
        if (local_4b0 == (long *)0x0) {
          local_4b0 = (long *)mcpl_internal_calloc(local_440,8);
        }
        local_4b0[(int)uVar16] = (long)pcVar25;
        uVar16 = uVar16 + 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
LAB_00106740:
        local_468 = pcVar6;
        local_470 = pcVar19;
        if (uVar26 == uVar21) {
          bVar2 = !bVar2;
          if (!bVar27) goto LAB_00106955;
          goto LAB_0010694e;
        }
      }
      if (*pcVar25 != '-') goto LAB_00106592;
      if (pcVar25[1] != '-') {
        pcVar25 = pcVar25 + 2;
        lVar10 = sVar9 - 2;
        puVar15 = (uint64_t *)0x0;
        do {
          bVar18 = pcVar25[-1];
          if (puVar15 != (uint64_t *)0x0) {
            if (0xf5 < (byte)(bVar18 - 0x3a)) {
              uVar24 = *puVar15;
              *puVar15 = uVar24 * 10;
              *puVar15 = (uVar24 * 10 + (long)pcVar25[-1]) - 0x30;
              goto LAB_00106697;
            }
            free(local_4b0);
            pcVar25 = "Bad option: expected number";
            goto LAB_001072ef;
          }
          if (0x14 < bVar18 - 0x62) goto switchD_0010662e_caseD_63;
          puVar15 = &local_450;
          switch((uint)bVar18) {
          case 0x62:
            if (local_470 != (char *)0x0) {
              free(local_4b0);
              pcVar25 = "-b specified more than once";
              goto LAB_001072ef;
            }
            pcVar19 = pcVar25;
            pcVar6 = local_468;
            if (lVar10 == 0) {
              free(local_4b0);
              pcVar25 = "Missing argument for -b";
              goto LAB_001072ef;
            }
            goto LAB_00106740;
          default:
            goto switchD_0010662e_caseD_63;
          case 0x65:
            bVar3 = true;
            break;
          case 0x68:
            goto switchD_0010662e_caseD_68;
          case 0x6a:
            cVar4 = '\x01';
            break;
          case 0x6c:
            goto switchD_0010662e_caseD_6c;
          case 0x6d:
            bVar20 = true;
            break;
          case 0x6e:
            cVar5 = '\x01';
            break;
          case 0x70:
            if (local_468 != (char *)0x0) {
              free(local_4b0);
              pcVar25 = "-p specified more than once";
              goto LAB_001072ef;
            }
            pcVar19 = local_470;
            pcVar6 = pcVar25;
            if (lVar10 == 0) {
              free(local_4b0);
              pcVar25 = "Missing argument for -p";
              goto LAB_001072ef;
            }
            goto LAB_00106740;
          case 0x72:
            local_460 = 1;
            break;
          case 0x73:
            puVar15 = &local_478;
switchD_0010662e_caseD_6c:
            *puVar15 = 0;
            if (lVar10 != 0) goto LAB_00106697;
            free(local_4b0);
            pcVar25 = "Bad option: missing number";
            goto LAB_001072ef;
          case 0x74:
            bVar7 = 1;
            break;
          case 0x76:
            local_458 = 1;
          }
          puVar15 = (uint64_t *)0x0;
LAB_00106697:
          pcVar25 = pcVar25 + 1;
          bVar28 = lVar10 != 0;
          lVar10 = lVar10 + -1;
          pcVar19 = local_470;
          pcVar6 = local_468;
        } while (bVar28);
        goto LAB_00106740;
      }
      cVar14 = '-';
      if (sVar9 < 3) goto LAB_00106589;
      if (pcVar25[1] != '-') goto LAB_001068a8;
      pcVar25 = pcVar25 + 2;
      sVar9 = strlen(pcVar25);
      iVar8 = strncmp("help",pcVar25,sVar9);
      if (iVar8 == 0) {
switchD_0010662e_caseD_68:
        free(local_4b0);
        iVar8 = mcpl_tool_usage(argv,(char *)0x0);
        return iVar8;
      }
      iVar8 = strncmp("justhead",pcVar25,sVar9);
      if (iVar8 == 0) {
        cVar4 = '\x01';
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("nohead",pcVar25,sVar9);
      if (iVar8 == 0) {
        cVar5 = '\x01';
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("merge",pcVar25,sVar9);
      if (iVar8 == 0) {
        bVar20 = true;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("forcemerge",pcVar25,sVar9);
      if (iVar8 == 0) {
        local_448 = 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("keepuserflags",pcVar25,sVar9);
      if (iVar8 == 0) {
        local_494 = 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("inplace",pcVar25,sVar9);
      if (iVar8 == 0) {
        bVar17 = 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("extract",pcVar25,sVar9);
      if (iVar8 == 0) {
        bVar3 = true;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("repair",pcVar25,sVar9);
      if (iVar8 == 0) {
        local_460 = 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("version",pcVar25,sVar9);
      if (iVar8 == 0) {
        local_458 = 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("preventcomment",pcVar25,sVar9);
      if (iVar8 == 0) {
        bVar2 = true;
        pcVar19 = local_470;
        pcVar6 = local_468;
        goto LAB_00106740;
      }
      iVar8 = strncmp("fakeversion",pcVar25,sVar9);
      if (iVar8 != 0) {
        iVar8 = strncmp("text",pcVar25,sVar9);
        bVar7 = 1;
        pcVar19 = local_470;
        pcVar6 = local_468;
        if (iVar8 == 0) goto LAB_00106740;
switchD_0010662e_caseD_63:
        free(local_4b0);
        pcVar25 = "Unrecognised option";
        goto LAB_001072ef;
      }
      bVar27 = true;
    } while (uVar26 != uVar21);
    bVar2 = !bVar2;
LAB_0010694e:
    mcpl_internal_fakeconstantversion_fakev = '\x01';
LAB_00106955:
    bVar27 = local_468 != (char *)0x0;
    if ((!bVar3) && (local_468 != (char *)0x0)) {
      free(local_4b0);
      pcVar25 = "-p can only be used with --extract.";
      goto LAB_001072ef;
    }
    if ((!bVar20 & bVar17) == 1) {
      free(local_4b0);
      pcVar25 = "--inplace can only be used with --merge.";
      goto LAB_001072ef;
    }
    local_4a0 = local_448 == 0;
    if (local_494 != 0 && local_4a0) {
      free(local_4b0);
      pcVar25 = "--keepuserflags can only be used with --forcemerge.";
      goto LAB_001072ef;
    }
    bVar28 = local_448 != 0;
    if (bVar20 && bVar28) {
      free(local_4b0);
      pcVar25 = "--merge and --forcemerge can not both be specified .";
      goto LAB_001072ef;
    }
    bVar29 = local_470 != (char *)0x0;
    bVar18 = bVar29 + cVar4 + cVar5;
    pcVar25 = (char *)0x1;
    if (!bVar3) goto LAB_001067f4;
  }
  if (1 < (int)(((uint)bVar7 + (int)local_460 + (int)local_458 + (uint)(byte)(bVar20 | bVar28) +
                 (uint)(byte)((byte)pcVar25 | bVar27) + 1) - (uint)(bVar18 == 0))) {
    free(local_4b0);
    pcVar25 = "Conflicting options specified.";
    goto LAB_001072ef;
  }
  if (bVar29 && 1 < bVar18) {
    free(local_4b0);
    pcVar25 = "Do not specify other dump options with -b.";
    goto LAB_001072ef;
  }
  if ((int)local_458 != 0) {
    free(local_4b0);
    if (uVar16 == 0) {
      if (mcpl_internal_fakeconstantversion_fakev == '\x01') {
        pcVar25 = "MCPL version 99.99.99";
      }
      else {
        pcVar25 = "MCPL version 2.0.0";
      }
      puts(pcVar25);
      return 0;
    }
    pcVar25 = "Unrecognised arguments for --version.";
    goto LAB_001072ef;
  }
  if ((bVar20 | bVar28) != 0) {
    if ((int)uVar16 < 2) {
      free(local_4b0);
      pcVar25 = "Too few arguments for --merge.";
      if (bVar28 != false) {
        pcVar25 = "Too few arguments for --forcemerge.";
      }
      goto LAB_001072ef;
    }
    if ((bVar28 == false) && (2 - bVar17 < uVar16)) {
      uVar23 = (ulong)(2 - bVar17);
      do {
        pcVar25 = (char *)local_4b0[uVar23];
        iVar8 = mcpl_can_merge((char *)local_4b0[bVar17 ^ 1],pcVar25);
        if (iVar8 == 0) {
          free(local_4b0);
          pcVar25 = "Requested files are incompatible for merge as they have different header info."
          ;
          goto LAB_001072ef;
        }
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
    }
    if (bVar17 != 0) {
      if ((local_4a0 & bVar20) != 1) {
        pcVar19 = "logic error in argument parsing";
        mcpl_error("logic error in argument parsing");
        pcVar19 = (char *)write(1,pcVar19,(size_t)pcVar25);
        if (pcVar19 == pcVar25) {
          return (int)pcVar19;
        }
        (*mcpl_error_handler)("Problems writing to stdout");
        printf("MCPL ERROR: %s\n",
               "Handler given to mcpl_set_error_handler returns to calling code which is not allowed!"
              );
        exit(1);
      }
      uVar23 = 1;
      do {
        mcpl_merge_inplace((char *)*local_4b0,(char *)local_4b0[uVar23]);
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
      goto LAB_00106b54;
    }
    iVar8 = mcpl_file_certainly_exists((char *)*local_4b0);
    if (iVar8 != 0) goto LAB_00106d04;
    pcVar25 = (char *)*local_4b0;
    sVar9 = strlen(pcVar25);
    if (sVar9 < 9) {
      bVar27 = true;
      if (3 < sVar9) goto LAB_00106f39;
    }
    else {
      iVar8 = strcmp(pcVar25 + (sVar9 - 8),".mcpl.gz");
      if (iVar8 == 0) {
        pcVar25 = mcpl_internal_malloc(sVar9 - 2);
        memcpy(pcVar25,(void *)*local_4b0,sVar9 - 3);
        pcVar25[sVar9 - 3] = '\0';
        iVar8 = mcpl_file_certainly_exists(pcVar25);
        if (iVar8 != 0) {
          free(local_4b0);
          pcVar25 = "Requested output file already exists (without .gz extension).";
          goto LAB_001072ef;
        }
        bVar27 = false;
      }
      else {
LAB_00106f39:
        iVar8 = strcmp(pcVar25 + (sVar9 - 3),".gz");
        bVar27 = true;
        if (iVar8 == 0) {
          free(local_4b0);
          pcVar25 = "Requested output file should not have .gz extension (unless it is .mcpl.gz).";
          goto LAB_001072ef;
        }
      }
    }
    if (bVar28 == false) {
      mVar13 = mcpl_merge_files(pcVar25,uVar16 - 1,(char **)(local_4b0 + 1));
    }
    else {
      mVar13 = mcpl_forcemerge_files(pcVar25,uVar16 - 1,(char **)(local_4b0 + 1),local_494);
    }
    if (bVar27) {
      mcpl_close_outfile(mVar13);
    }
    else {
      iVar8 = mcpl_closeandgzip_outfile(mVar13);
      if (iVar8 == 0) {
        printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",pcVar25);
      }
    }
    if (pcVar25 != (char *)*local_4b0) {
      free(pcVar25);
    }
    goto LAB_00106b54;
  }
  if ((byte)pcVar25 == 0) {
    if (bVar7 == 0) {
      if ((int)uVar16 < 2) {
        if (uVar16 == 0) {
          free(local_4b0);
          pcVar25 = "No input file specified";
          goto LAB_001072ef;
        }
        if ((int)local_460 != 0) {
          mcpl_repair((char *)*local_4b0);
          goto LAB_00106b54;
        }
        if (bVar29) {
          local_438._0_4_ = 0;
          mVar11 = mcpl_actual_open_file((char *)*local_4b0,(int *)&local_438);
          iVar8 = mcpl_hdr_blob(mVar11,local_470,&local_444,(char **)&local_438);
          if (iVar8 != 0) {
            mcpl_internal_dump_to_stdout
                      ((char *)CONCAT44(local_438._4_4_,(int)local_438),(ulong)local_444);
            free(local_4b0);
          }
          mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar11.internal);
          return (uint)(iVar8 == 0);
        }
        if (cVar4 == '\0') {
          if ((long)local_450 < 0) goto LAB_00107213;
        }
        else {
          if ((local_450 != 0xffffffffffffffff) || (local_478 != 0xffffffffffffffff)) {
            free(local_4b0);
            pcVar25 = "Do not specify -l or -s with --justhead";
            goto LAB_001072ef;
          }
LAB_00107213:
          local_450 = 10;
        }
        if ((long)local_478 < 0) {
          local_478 = 0;
        }
        if ((cVar4 == '\0') || (cVar5 == '\0')) {
          uVar16 = 2;
          if (cVar5 == '\0') {
            uVar16 = (uint)(cVar4 != '\0');
          }
          mcpl_dump((char *)*local_4b0,uVar16,local_478,local_450);
LAB_00106b54:
          free(local_4b0);
          return 0;
        }
        free(local_4b0);
        pcVar25 = "Do not supply both --justhead and --nohead.";
        goto LAB_001072ef;
      }
    }
    else if ((int)uVar16 < 3) {
      if (uVar16 != 2) {
        free(local_4b0);
        pcVar25 = "Must specify both input and output files with --text.";
        goto LAB_001072ef;
      }
      iVar8 = mcpl_file_certainly_exists((char *)local_4b0[1]);
      if (iVar8 == 0) {
        local_438._0_4_ = 0;
        mVar11 = mcpl_actual_open_file((char *)*local_4b0,(int *)&local_438);
        __stream = (FILE *)mcpl_internal_fopen((char *)local_4b0[1],"w");
        if (__stream != (FILE *)0x0) {
          fprintf(__stream,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %lu\n#END-HEADER\n",
                  *(undefined8 *)((long)mVar11.internal + 0x40));
          fwrite("index     pdgcode               ekin[MeV]                   x[cm]                   y[cm]                   z[cm]                      ux                      uy                      uz                time[ms]                  weight                   pol-x                   pol-y                   pol-z  userflags\n"
                 ,0x13d,1,__stream);
          pmVar12 = mcpl_read(mVar11);
          while (pmVar12 != (mcpl_particle_t *)0x0) {
            fprintf(__stream,
                    "%5lu %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n"
                    ,pmVar12->ekin,pmVar12->position[0],pmVar12->position[1],pmVar12->position[2],
                    pmVar12->direction[0],pmVar12->direction[1],pmVar12->direction[2],pmVar12->time,
                    *(long *)((long)mVar11.internal + 0x88) + -1,(ulong)(uint)pmVar12->pdgcode,
                    (ulong)pmVar12->userflags);
            pmVar12 = mcpl_read(mVar11);
          }
          fclose(__stream);
          mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar11.internal);
          goto LAB_0010714f;
        }
        mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar11.internal);
        free(local_4b0);
        pcVar25 = "Could not open output file.";
        goto LAB_001072ef;
      }
      goto LAB_00106d04;
    }
  }
  else if ((int)uVar16 < 3) {
    if (uVar16 != 2) {
      free(local_4b0);
      pcVar25 = "Must specify both input and output files with --extract.";
      goto LAB_001072ef;
    }
    iVar8 = mcpl_file_certainly_exists((char *)local_4b0[1]);
    if (iVar8 == 0) {
      local_438._0_4_ = 0;
      mVar11 = mcpl_actual_open_file((char *)*local_4b0,(int *)&local_438);
      mVar13 = mcpl_create_outfile((char *)local_4b0[1]);
      mcpl_transfer_metadata(mVar11,mVar13);
      uVar1 = *(undefined8 *)((long)mVar11.internal + 0x40);
      if (bVar2) {
        snprintf((char *)&local_438,0x400,
                 "mcpltool: extracted particles from file with %lu particles",uVar1);
        mcpl_hdr_add_comment(mVar13,(char *)&local_438);
      }
      lVar10 = 0;
      if ((bVar27 == false) ||
         ((iVar8 = mcpl_str2int(local_468,0,&local_438), iVar8 != 0 &&
          (lVar10 = CONCAT44(local_438._4_4_,(int)local_438),
          lVar10 != 0 && (int)local_438 == lVar10)))) {
        if (0 < (long)local_478) {
          mcpl_seek(mVar11,local_478);
        }
        uVar24 = 0xffffffffffffffff;
        if (0 < (long)local_450) {
          uVar24 = local_450;
        }
        lVar22 = 0;
        do {
          pmVar12 = mcpl_read(mVar11);
          if (pmVar12 == (mcpl_particle_t *)0x0) break;
          if (((int)lVar10 == 0) || ((int)lVar10 == pmVar12->pdgcode)) {
            mcpl_transfer_last_read_particle(mVar11,mVar13);
            lVar22 = lVar22 + 1;
          }
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
        pcVar25 = *mVar13.internal;
        sVar9 = strlen(pcVar25);
        pcVar19 = mcpl_internal_malloc(sVar9 + 4);
        memcpy(pcVar19,pcVar25,sVar9 + 1);
        iVar8 = mcpl_closeandgzip_outfile(mVar13);
        if (iVar8 != 0) {
          builtin_strncpy(pcVar19 + sVar9,".gz",4);
        }
        mcpl_internal_cleanup_file((mcpl_fileinternal_t *)mVar11.internal);
        printf("MCPL: Successfully extracted %lu / %lu particles from %s into %s\n",lVar22,uVar1,
               *local_4b0,pcVar19);
        free(pcVar19);
LAB_0010714f:
        free(local_4b0);
        return 0;
      }
      free(local_4b0);
      pcVar25 = "Must specify non-zero 32bit integer as argument to -p.";
      goto LAB_001072ef;
    }
LAB_00106d04:
    free(local_4b0);
    pcVar25 = "Requested output file already exists.";
    goto LAB_001072ef;
  }
  free(local_4b0);
  pcVar25 = "Too many arguments.";
LAB_001072ef:
  printf("ERROR: %s\n\n",pcVar25);
  puts("Run with -h or --help for usage information");
  return 1;
}

Assistant:

int mcpl_tool(int argc,char** argv) {

  int nfilenames = 0;
  char ** filenames = NULL;
  const char * blobkey = NULL;
  const char * pdgcode_str = NULL;
  int opt_justhead = 0;
  int opt_nohead = 0;
  int64_t opt_num_limit = -1;
  int64_t opt_num_skip = -1;
  int opt_merge = 0;
  int opt_forcemerge = 0;
  int opt_keepuserflags = 0;
  int opt_inplace = 0;
  int opt_extract = 0;
  int opt_preventcomment = 0;//undocumented unoffical flag for mcpl unit tests
  int opt_repair = 0;
  int opt_version = 0;
  int opt_text = 0;
  int opt_fakeversion = 0;//undocumented unoffical flag for mcpl unit tests

  int i;
  for (i = 1; i<argc; ++i) {
    char * a = argv[i];
    size_t n=strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = NULL;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9') {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: expected number");
          }
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        if (a[j]=='b') {
          if (blobkey) {
            free(filenames);
            return mcpl_tool_usage(argv,"-b specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -b");
          }
          blobkey = a+j+1;
          break;
        }
        if (a[j]=='p') {
          if (pdgcode_str) {
            free(filenames);
            return mcpl_tool_usage(argv,"-p specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -p");
          }
          pdgcode_str = a+j+1;
          break;
        }

        switch(a[j]) {
        case 'h':
          {
            free(filenames);
            return mcpl_tool_usage(argv,0);
          }
        case 'j': opt_justhead = 1; break;
        case 'n': opt_nohead = 1; break;
        case 'm': opt_merge = 1; break;
        case 'e': opt_extract = 1; break;
        case 'r': opt_repair = 1; break;
        case 'v': opt_version = 1; break;
        case 't': opt_text = 1; break;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_skip; break;
        default:
          {
            free(filenames);
            return mcpl_tool_usage(argv,"Unrecognised option");
          }
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: missing number");
          }
        }
      }
    } else if (n>=3&&a[0]=='-'&&a[1]=='-') {
      a+=2;
      //long options:
      const char * lo_help = "help";
      const char * lo_justhead = "justhead";
      const char * lo_nohead = "nohead";
      const char * lo_merge = "merge";
      const char * lo_inplace = "inplace";
      const char * lo_extract = "extract";
      const char * lo_preventcomment = "preventcomment";
      const char * lo_fakeversion = "fakeversion";
      const char * lo_repair = "repair";
      const char * lo_version = "version";
      const char * lo_text = "text";
      const char * lo_forcemerge = "forcemerge";
      const char * lo_keepuserflags = "keepuserflags";
      //Use strstr instead of "strcmp(a,"--help")==0" to support shortened
      //versions (works since all our long-opts start with unique char).
      if (strstr(lo_help,a)==lo_help) return free(filenames), mcpl_tool_usage(argv,0);
      else if (strstr(lo_justhead,a)==lo_justhead) opt_justhead = 1;
      else if (strstr(lo_nohead,a)==lo_nohead) opt_nohead = 1;
      else if (strstr(lo_merge,a)==lo_merge) opt_merge = 1;
      else if (strstr(lo_forcemerge,a)==lo_forcemerge) opt_forcemerge = 1;
      else if (strstr(lo_keepuserflags,a)==lo_keepuserflags) opt_keepuserflags = 1;
      else if (strstr(lo_inplace,a)==lo_inplace) opt_inplace = 1;
      else if (strstr(lo_extract,a)==lo_extract) opt_extract = 1;
      else if (strstr(lo_repair,a)==lo_repair) opt_repair = 1;
      else if (strstr(lo_version,a)==lo_version) opt_version = 1;
      else if (strstr(lo_preventcomment,a)==lo_preventcomment) opt_preventcomment = 1;
      else if (strstr(lo_fakeversion,a)==lo_fakeversion) opt_fakeversion = 1;
      else if (strstr(lo_text,a)==lo_text) opt_text = 1;
      else return free(filenames),mcpl_tool_usage(argv,"Unrecognised option");
    } else if (n>=1&&a[0]!='-') {
      //input file
      if (!filenames)
        filenames = (char **)mcpl_internal_calloc(argc,sizeof(char*));
      filenames[nfilenames] = a;
      ++nfilenames;
    } else {
      return free(filenames),mcpl_tool_usage(argv,"Bad arguments");
    }
  }

  if ( opt_fakeversion )
    mcpl_internal_fakeconstantversion(1);

  if ( opt_extract==0 && pdgcode_str )
    return free(filenames),mcpl_tool_usage(argv,"-p can only be used with --extract.");

  if ( opt_merge==0 && opt_inplace!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--inplace can only be used with --merge.");

  if ( opt_forcemerge==0 && opt_keepuserflags!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--keepuserflags can only be used with --forcemerge.");

  if ( opt_merge!=0 && opt_forcemerge!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--merge and --forcemerge can not both be specified .");

  int number_dumpopts = (opt_justhead + opt_nohead + (blobkey!=0));
  if (opt_extract==0)
    number_dumpopts += (opt_num_limit!=-1) + (opt_num_skip!=-1);
  int any_dumpopts = number_dumpopts != 0;
  int any_extractopts = (opt_extract!=0||pdgcode_str!=0);
  int any_mergeopts = (opt_merge!=0||opt_forcemerge!=0);
  int any_textopts = (opt_text!=0);
  if (any_dumpopts+any_mergeopts+any_extractopts+any_textopts+opt_repair+opt_version>1)
    return free(filenames),mcpl_tool_usage(argv,"Conflicting options specified.");

  if (blobkey&&(number_dumpopts>1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify other dump options with -b.");

  if (opt_version) {
    free(filenames);
    if (nfilenames)
      return mcpl_tool_usage(argv,"Unrecognised arguments for --version.");

    if ( mcpl_internal_fakeconstantversion(0) )
      printf("MCPL version " "99.99.99" "\n");
    else
      printf("MCPL version " MCPL_VERSION_STR "\n");
    return 0;
  }

  if (any_mergeopts) {

    if (nfilenames<2)
      return free(filenames),mcpl_tool_usage(argv,
                                             (opt_forcemerge?"Too few arguments for --forcemerge.":"Too few arguments for --merge.") );

    int ifirstinfile = (opt_inplace ? 0 : 1);
    if (!opt_forcemerge) {
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        if (!mcpl_can_merge(filenames[ifirstinfile],filenames[i]))
          return free(filenames),mcpl_tool_usage(argv,"Requested files are incompatible for merge as they have different header info.");
    }

    if (opt_inplace) {
      if ( ! ( !opt_forcemerge && opt_merge) )
        mcpl_error("logic error in argument parsing");
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        mcpl_merge_inplace(filenames[ifirstinfile],filenames[i]);
    } else {
      if (mcpl_file_certainly_exists(filenames[0]))
        return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

      //Disallow .gz endings unless it is .mcpl.gz, in which case we attempt to gzip automatically.
      char * outfn = filenames[0];
      size_t lfn = strlen(outfn);
      int attempt_gzip = 0;
      if( lfn > 8 && !strcmp(outfn + (lfn - 8), ".mcpl.gz")) {
        attempt_gzip = 1;
        outfn = mcpl_internal_malloc(lfn-2);//lfn+1-3
        memcpy(outfn,filenames[0],lfn-3);
        outfn[lfn-3] = '\0';
        if (mcpl_file_certainly_exists(outfn))
          return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists (without .gz extension).");
      } else if( lfn > 3 && !strcmp(outfn + (lfn - 3), ".gz")) {
        return free(filenames),mcpl_tool_usage(argv,"Requested output file should not have .gz extension (unless it is .mcpl.gz).");
      }

      mcpl_outfile_t mf = ( opt_forcemerge ?
                            mcpl_forcemerge_files( outfn, nfilenames-1, (const char**)filenames + 1, opt_keepuserflags) :
                            mcpl_merge_files( outfn, nfilenames-1, (const char**)filenames + 1) );
      if (attempt_gzip) {
        if (!mcpl_closeandgzip_outfile(mf))
          printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",outfn);
      } else {
        mcpl_close_outfile(mf);
      }
      if (outfn != filenames[0])
        free(outfn);
    }

    free(filenames);
    return 0;
  }

  if (opt_extract) {
    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --extract.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    mcpl_outfile_t fo = mcpl_create_outfile(filenames[1]);
    mcpl_transfer_metadata(fi, fo);
    uint64_t fi_nparticles = mcpl_hdr_nparticles(fi);

    if (!opt_preventcomment) {
      char comment[1024];
      snprintf(comment, sizeof(comment), "mcpltool: extracted particles from"
               " file with %" PRIu64 " particles",fi_nparticles);
      mcpl_hdr_add_comment(fo,comment);
    }

    int32_t pdgcode_select = 0;
    if (pdgcode_str) {
      int64_t pdgcode64;
      if (!mcpl_str2int(pdgcode_str, 0, &pdgcode64) || -pdgcode64>2147483648 || pdgcode64>2147483647 || !pdgcode64)
        return free(filenames),mcpl_tool_usage(argv,"Must specify non-zero 32bit integer as argument to -p.");
      pdgcode_select = (int32_t)pdgcode64;
    }

    if (opt_num_skip>0)
      mcpl_seek(fi,(uint64_t)opt_num_skip);

    //uint64_t(-1) instead of UINT64_MAX to fix clang c++98 compilation
    uint64_t left = opt_num_limit>0 ? (uint64_t)opt_num_limit : (uint64_t)-1;
    uint64_t added = 0;

    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    for (;left;) {
      --left;
      const mcpl_particle_t* particle = mcpl_read(fi);
      if (!particle)
        break;
      if (pdgcode_select && pdgcode_select!= particle->pdgcode)
        continue;
      mcpl_transfer_last_read_particle(fi, fo);//Doing mcpl_add_particle(fo,particle) is potentially (very rarely) lossy
      ++added;
    }

    const char * outfile_fn = mcpl_outfile_filename(fo);
    size_t nn = strlen(outfile_fn);
    char *fo_filename = mcpl_internal_malloc(nn+4);
    //fo_filename[0] = '\0';
    memcpy(fo_filename,outfile_fn,nn+1);
    //memcpy(fo_filename+nn,".gz",4);
    //  strncat(fo_filename,mcpl_outfile_filename(fo),nn);
    if (mcpl_closeandgzip_outfile(fo))
      memcpy(fo_filename+nn,".gz",4);
    //strncat(fo_filename,".gz",3);
    mcpl_close_file(fi);

    printf("MCPL: Successfully extracted %" PRIu64 " / %" PRIu64 " particles from %s into %s\n",
           added,fi_nparticles,filenames[0],fo_filename);
    free(fo_filename);
    free(filenames);
    return 0;
  }

  if (opt_text) {

    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --text.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    FILE * fout = mcpl_internal_fopen(filenames[1],"w");
    if (!fout) {
      mcpl_close_file(fi);
      free(filenames);
      return mcpl_tool_usage(argv,"Could not open output file.");
    }

    fprintf(fout,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %" PRIu64 "\n#END-HEADER\n",mcpl_hdr_nparticles(fi));
    fprintf(fout,"index     pdgcode               ekin[MeV]                   x[cm]          "
            "         y[cm]                   z[cm]                      ux                  "
            "    uy                      uz                time[ms]                  weight  "
            "                 pol-x                   pol-y                   pol-z  userflags\n");
    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    while (1) {
      const mcpl_particle_t* p = mcpl_read(fi);
      if (!p)
        break;
      uint64_t idx = mcpl_currentposition(fi)-1;//-1 since mcpl_read skipped ahead
      fprintf( fout,"%5" PRIu64
               " %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g"
               " %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n",
               idx,p->pdgcode,p->ekin,p->position[0],p->position[1],p->position[2],
               p->direction[0],p->direction[1],p->direction[2],p->time,p->weight,
               p->polarisation[0],p->polarisation[1],p->polarisation[2],p->userflags);
    }
    fclose(fout);
    mcpl_close_file(fi);
    free(filenames);
    return 0;
  }

  if (nfilenames>1)
    return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

  if (!nfilenames)
    return free(filenames),mcpl_tool_usage(argv,"No input file specified");

  if (opt_repair) {
    mcpl_repair(filenames[0]);
    free(filenames);
    return 0;
  }

  //Dump mode:
  if (blobkey) {
    mcpl_file_t mcplfile = mcpl_open_file(filenames[0]);
    uint32_t ldata;
    const char * data;
    if (!mcpl_hdr_blob(mcplfile, blobkey, &ldata, &data)) {
      mcpl_close_file(mcplfile);
      return 1;
    }
    mcpl_internal_dump_to_stdout( data, ldata );
    free(filenames);
    mcpl_close_file(mcplfile);
    return 0;
  }

  if (opt_justhead&&(opt_num_limit!=-1||opt_num_skip!=-1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify -l or -s with --justhead");

  if (opt_num_limit<0) opt_num_limit = MCPLIMP_TOOL_DEFAULT_NLIMIT;
  if (opt_num_skip<0) opt_num_skip = MCPLIMP_TOOL_DEFAULT_NSKIP;

  if (opt_justhead&&opt_nohead)
    return free(filenames),mcpl_tool_usage(argv,"Do not supply both --justhead and --nohead.");

  int parts = 0;
  if (opt_nohead) parts=2;
  else if (opt_justhead) parts=1;
  mcpl_dump(filenames[0],parts,opt_num_skip,opt_num_limit);
  free(filenames);
  return 0;
}